

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  cmSystemToolsFileTime *t;
  char *message_00;
  allocator local_5b9;
  string local_5b8 [8];
  string message;
  undefined1 local_578 [8];
  ostringstream e_2;
  allocator local_3f9;
  string local_3f8;
  bool local_3d1;
  undefined1 local_3d0 [7];
  bool removed;
  string emsg;
  bool have_ft;
  cmSystemToolsFileTime *ft;
  undefined1 local_398 [7];
  bool success;
  ostringstream local_378 [8];
  ostringstream e_1;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream e;
  uint local_30;
  uint i;
  Doing doing;
  char *file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  _i = (char *)0x0;
  bVar2 = false;
  local_30 = 1;
  do {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar3 <= local_30) {
      if (_i == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_1f8,"RPATH_REMOVE not given FILE option.",&local_1f9);
        cmCommand::SetError(&this->super_cmCommand,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        this_local._7_1_ = false;
      }
      else {
        bVar2 = cmsys::SystemTools::FileExists(_i,true);
        if (bVar2) {
          t = cmSystemTools::FileTimeNew();
          emsg.field_2._M_local_buf[0xf] = cmSystemTools::FileTimeGet(_i,t);
          std::__cxx11::string::string((string *)local_3d0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3f8,_i,&local_3f9);
          bVar2 = cmSystemTools::RemoveRPath(&local_3f8,(string *)local_3d0,&local_3d1);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
          bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
            poVar5 = std::operator<<((ostream *)local_578,
                                     "RPATH_REMOVE could not remove RPATH from file:\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,_i);
            poVar5 = std::operator<<(poVar5,"\n");
            std::operator<<(poVar5,(string *)local_3d0);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
            std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_578);
          }
          ft._7_1_ = !bVar2;
          if (ft._7_1_) {
            if ((local_3d1 & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_5b8,"Removed runtime path from \"",&local_5b9);
              std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
              std::__cxx11::string::operator+=(local_5b8,_i);
              std::__cxx11::string::operator+=(local_5b8,"\"");
              this_00 = (this->super_cmCommand).Makefile;
              message_00 = (char *)std::__cxx11::string::c_str();
              cmMakefile::DisplayStatus(this_00,message_00,-1.0);
              std::__cxx11::string::~string(local_5b8);
            }
            if ((emsg.field_2._M_local_buf[0xf] & 1U) != 0) {
              cmSystemTools::FileTimeSet(_i,t);
            }
          }
          cmSystemTools::FileTimeDelete(t);
          this_local._7_1_ = ft._7_1_;
          std::__cxx11::string::~string((string *)local_3d0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_378);
          poVar5 = std::operator<<((ostream *)local_378,"RPATH_REMOVE given FILE \"");
          poVar5 = std::operator<<(poVar5,_i);
          std::operator<<(poVar5,"\" that does not exist.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_398);
          std::__cxx11::string::~string((string *)local_398);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream(local_378);
        }
      }
      return this_local._7_1_;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_30);
    bVar1 = std::operator==(pvVar4,"FILE");
    if (bVar1) {
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar5 = std::operator<<((ostream *)local_1a8,"RPATH_REMOVE given unknown argument ");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_30);
        std::operator<<(poVar5,(string *)pvVar4);
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        return false;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,(ulong)local_30);
      _i = (char *)std::__cxx11::string::c_str();
      bVar2 = false;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathRemoveCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = CM_NULLPTR;
  enum Doing
  {
    DoingNone,
    DoingFile
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_REMOVE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (!file) {
    this->SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_REMOVE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_REMOVE could not remove RPATH from file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message = "Removed runtime path from \"";
      message += file;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}